

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

void __thiscall efsw::DirWatcherGeneric::watch(DirWatcherGeneric *this,bool reportOwnChange)

{
  WatchID WVar1;
  FileWatchListener *pFVar2;
  bool bVar3;
  reference pFVar4;
  reference ppVar5;
  reference ppVar6;
  pointer ppVar7;
  _Self local_400;
  _Self local_3f8;
  iterator dit;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  _Self local_388;
  _List_node_base *local_380;
  _List_node_base *local_378;
  string local_370;
  allocator<char> local_349;
  string local_348;
  _Self local_328;
  _List_node_base *local_320;
  _List_node_base *local_318;
  allocator<char> local_309;
  string local_308;
  _Self local_2e8;
  _List_node_base *local_2e0;
  _List_node_base *local_2d8;
  string local_2d0;
  _Self local_2b0;
  _List_node_base *local_2a8;
  _List_node_base *local_2a0;
  string local_298;
  _Self local_278;
  _List_node_base *local_270;
  _List_node_base *local_268;
  allocator<char> local_259;
  string local_258;
  _Self local_238;
  _List_node_base *local_230;
  _List_node_base *local_228;
  allocator<char> local_219;
  string local_218;
  _Self local_1f8;
  _List_node_base *local_1f0;
  _List_node_base *local_1e8;
  allocator<char> local_1d9;
  string local_1d8;
  _Self local_1b8;
  _List_node_base *local_1b0;
  _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
  local_1a8;
  iterator mit;
  iterator it;
  string local_190 [32];
  string local_170;
  string local_150;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  DirectorySnapshotDiff Diff;
  bool reportOwnChange_local;
  DirWatcherGeneric *this_local;
  
  Diff._199_1_ = reportOwnChange;
  DirectorySnapshot::scan((DirectorySnapshotDiff *)local_e0,&this->DirSnap);
  if ((((Diff._199_1_ & 1) != 0) &&
      (((byte)Diff.DirsMoved.
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              ._M_impl._M_node._M_size & 1) != 0)) && (this->Parent != (DirWatcherGeneric *)0x0)) {
    WVar1 = (this->Watch->super_Watcher).ID;
    pFVar2 = (this->Watch->super_Watcher).Listener;
    std::__cxx11::string::string((string *)&local_120,(string *)&this->DirSnap);
    FileSystem::pathRemoveFileName(&local_100,&local_120);
    std::__cxx11::string::string((string *)&local_170,(string *)&this->DirSnap);
    FileSystem::fileNameFromPath(&local_150,&local_170);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_190,"",(allocator<char> *)((long)&it._M_node + 7));
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,&local_100,&local_150,3,local_190);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  bVar3 = DirectorySnapshotDiff::changed((DirectorySnapshotDiff *)local_e0);
  if (bVar3) {
    std::_List_iterator<efsw::FileInfo>::_List_iterator((_List_iterator<efsw::FileInfo> *)&mit);
    std::
    _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
    ::_List_iterator(&local_1a8);
    local_1b0 = (_List_node_base *)
                std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                           &Diff.FilesDeleted.
                            super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                            _M_impl._M_node._M_size);
    mit._M_node = local_1b0;
    while( true ) {
      local_1b8._M_node =
           (_List_node_base *)
           std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                      &Diff.FilesDeleted.
                       super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                       _M_node._M_size);
      bVar3 = std::operator!=((_Self *)&mit,&local_1b8);
      if (!bVar3) break;
      pFVar4 = std::_List_iterator<efsw::FileInfo>::operator*
                         ((_List_iterator<efsw::FileInfo> *)&mit);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1d9);
      handleAction(this,&pFVar4->Filepath,1,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      local_1e8 = (_List_node_base *)
                  std::_List_iterator<efsw::FileInfo>::operator++
                            ((_List_iterator<efsw::FileInfo> *)&mit,0);
    }
    local_1f0 = (_List_node_base *)
                std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                           &Diff.FilesCreated.
                            super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                            _M_impl._M_node._M_size);
    mit._M_node = local_1f0;
    while( true ) {
      local_1f8._M_node =
           (_List_node_base *)
           std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                      &Diff.FilesCreated.
                       super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                       _M_node._M_size);
      bVar3 = std::operator!=((_Self *)&mit,&local_1f8);
      if (!bVar3) break;
      pFVar4 = std::_List_iterator<efsw::FileInfo>::operator*
                         ((_List_iterator<efsw::FileInfo> *)&mit);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"",&local_219);
      handleAction(this,&pFVar4->Filepath,3,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      local_228 = (_List_node_base *)
                  std::_List_iterator<efsw::FileInfo>::operator++
                            ((_List_iterator<efsw::FileInfo> *)&mit,0);
    }
    local_230 = (_List_node_base *)
                std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)local_e0);
    mit._M_node = local_230;
    while( true ) {
      local_238._M_node =
           (_List_node_base *)
           std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)local_e0);
      bVar3 = std::operator!=((_Self *)&mit,&local_238);
      if (!bVar3) break;
      pFVar4 = std::_List_iterator<efsw::FileInfo>::operator*
                         ((_List_iterator<efsw::FileInfo> *)&mit);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"",&local_259);
      handleAction(this,&pFVar4->Filepath,2,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
      local_268 = (_List_node_base *)
                  std::_List_iterator<efsw::FileInfo>::operator++
                            ((_List_iterator<efsw::FileInfo> *)&mit,0);
    }
    local_270 = (_List_node_base *)
                std::__cxx11::
                list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                         *)&Diff.FilesModified.
                            super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                            _M_impl._M_node._M_size);
    local_1a8._M_node = local_270;
    while( true ) {
      local_278._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
           ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                  *)&Diff.FilesModified.
                     super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                     _M_node._M_size);
      bVar3 = std::operator!=(&local_1a8,&local_278);
      if (!bVar3) break;
      ppVar5 = std::
               _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
               ::operator*(&local_1a8);
      ppVar6 = std::
               _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
               ::operator*(&local_1a8);
      std::__cxx11::string::string((string *)&local_298,(string *)ppVar6);
      handleAction(this,&(ppVar5->second).Filepath,4,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      local_2a0 = (_List_node_base *)
                  std::
                  _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                  ::operator++(&local_1a8,0);
    }
    local_2a8 = (_List_node_base *)
                std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                           &Diff.DirsDeleted.
                            super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                            _M_impl._M_node._M_size);
    mit._M_node = local_2a8;
    while( true ) {
      local_2b0._M_node =
           (_List_node_base *)
           std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                      &Diff.DirsDeleted.
                       super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                       _M_node._M_size);
      bVar3 = std::operator!=((_Self *)&mit,&local_2b0);
      if (!bVar3) break;
      pFVar4 = std::_List_iterator<efsw::FileInfo>::operator*
                         ((_List_iterator<efsw::FileInfo> *)&mit);
      std::__cxx11::string::string((string *)&local_2d0,(string *)pFVar4);
      createDirectory(this,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      local_2d8 = (_List_node_base *)
                  std::_List_iterator<efsw::FileInfo>::operator++
                            ((_List_iterator<efsw::FileInfo> *)&mit,0);
    }
    local_2e0 = (_List_node_base *)
                std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                           &Diff.DirsCreated.
                            super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                            _M_impl._M_node._M_size);
    mit._M_node = local_2e0;
    while( true ) {
      local_2e8._M_node =
           (_List_node_base *)
           std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                      &Diff.DirsCreated.
                       super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                       _M_node._M_size);
      bVar3 = std::operator!=((_Self *)&mit,&local_2e8);
      if (!bVar3) break;
      pFVar4 = std::_List_iterator<efsw::FileInfo>::operator*
                         ((_List_iterator<efsw::FileInfo> *)&mit);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"",&local_309);
      handleAction(this,&pFVar4->Filepath,3,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator(&local_309);
      local_318 = (_List_node_base *)
                  std::_List_iterator<efsw::FileInfo>::operator++
                            ((_List_iterator<efsw::FileInfo> *)&mit,0);
    }
    local_320 = (_List_node_base *)
                std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                           &Diff.FilesMoved.
                            super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                            ._M_impl._M_node._M_size);
    mit._M_node = local_320;
    while( true ) {
      local_328._M_node =
           (_List_node_base *)
           std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                      &Diff.FilesMoved.
                       super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                       ._M_impl._M_node._M_size);
      bVar3 = std::operator!=((_Self *)&mit,&local_328);
      if (!bVar3) break;
      pFVar4 = std::_List_iterator<efsw::FileInfo>::operator*
                         ((_List_iterator<efsw::FileInfo> *)&mit);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"",&local_349);
      handleAction(this,&pFVar4->Filepath,2,&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator(&local_349);
      pFVar4 = std::_List_iterator<efsw::FileInfo>::operator*
                         ((_List_iterator<efsw::FileInfo> *)&mit);
      std::__cxx11::string::string((string *)&local_370,(string *)pFVar4);
      removeDirectory(this,&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      local_378 = (_List_node_base *)
                  std::_List_iterator<efsw::FileInfo>::operator++
                            ((_List_iterator<efsw::FileInfo> *)&mit,0);
    }
    local_380 = (_List_node_base *)
                std::__cxx11::
                list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                         *)&Diff.DirsModified.
                            super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                            _M_impl._M_node._M_size);
    local_1a8._M_node = local_380;
    while( true ) {
      local_388._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
           ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                  *)&Diff.DirsModified.
                     super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                     _M_node._M_size);
      bVar3 = std::operator!=(&local_1a8,&local_388);
      if (!bVar3) break;
      ppVar5 = std::
               _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
               ::operator*(&local_1a8);
      ppVar6 = std::
               _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
               ::operator*(&local_1a8);
      std::__cxx11::string::string((string *)&local_3a8,(string *)ppVar6);
      handleAction(this,&(ppVar5->second).Filepath,4,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      ppVar5 = std::
               _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
               ::operator*(&local_1a8);
      std::__cxx11::string::string((string *)&local_3c8,(string *)ppVar5);
      ppVar5 = std::
               _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
               ::operator*(&local_1a8);
      std::__cxx11::string::string((string *)&local_3e8,(string *)&ppVar5->second);
      moveDirectory(this,&local_3c8,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      dit._M_node = (_Base_ptr)
                    std::
                    _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                    ::operator++(&local_1a8,0);
    }
  }
  local_3f8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
       ::begin(&this->Directories);
  while( true ) {
    local_400._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
         ::end(&this->Directories);
    bVar3 = std::operator!=(&local_3f8,&local_400);
    if (!bVar3) break;
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
             ::operator->(&local_3f8);
    watch(ppVar7->second,false);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
    ::operator++(&local_3f8,0);
  }
  DirectorySnapshotDiff::~DirectorySnapshotDiff((DirectorySnapshotDiff *)local_e0);
  return;
}

Assistant:

void DirWatcherGeneric::watch( bool reportOwnChange )
{
	DirectorySnapshotDiff Diff = DirSnap.scan();

	if ( reportOwnChange && Diff.DirChanged && NULL != Parent )
	{
		Watch->Listener->handleFileAction( Watch->ID, FileSystem::pathRemoveFileName( DirSnap.DirectoryInfo.Filepath ), FileSystem::fileNameFromPath( DirSnap.DirectoryInfo.Filepath ), Actions::Modified );
	}

	if ( Diff.changed() )
	{
		FileInfoList::iterator it;
		MovedList::iterator mit;

		/// Files
		DiffIterator( FilesCreated )
		{
			handleAction( (*it).Filepath, Actions::Add );
		}

		DiffIterator( FilesModified )
		{
			handleAction( (*it).Filepath, Actions::Modified );
		}

		DiffIterator( FilesDeleted )
		{
			handleAction( (*it).Filepath, Actions::Delete );
		}

		DiffMovedIterator( FilesMoved )
		{
			handleAction( (*mit).second.Filepath, Actions::Moved, (*mit).first );
		}

		/// Directories
		DiffIterator( DirsCreated )
		{
			createDirectory( (*it).Filepath );
		}

		DiffIterator( DirsModified )
		{
			handleAction( (*it).Filepath, Actions::Modified );
		}

		DiffIterator( DirsDeleted )
		{
			handleAction( (*it).Filepath, Actions::Delete );
			removeDirectory( (*it).Filepath );
		}

		DiffMovedIterator( DirsMoved )
		{
			handleAction( (*mit).second.Filepath, Actions::Moved, (*mit).first );
			moveDirectory( (*mit).first, (*mit).second.Filepath );
		}
	}

	/// Process the subdirectories looking for changes
	for ( DirWatchMap::iterator dit = Directories.begin(); dit != Directories.end(); dit++ )
	{
		/// Just watch
		dit->second->watch();
	}
}